

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O0

void print_key_file(econf_file key_file)

{
  long in_stack_00000008;
  file_entry *local_10;
  size_t i;
  
  printf("----------------------------------\n");
  printf("path: %s\n",key_file._24_8_);
  printf("delimiter: %c, comment: %c\n",(ulong)(uint)(int)(char)key_file.alloc_length,
         (ulong)(uint)(int)key_file.alloc_length._1_1_);
  printf("values:\n");
  for (local_10 = (file_entry *)0x0; local_10 < key_file.file_entry;
      local_10 = (file_entry *)((long)&local_10->group + 1)) {
    printf("  group: %s ; key: %s ; value: %s ; pre_comment %s ; added_comment: %s\n",
           *(undefined8 *)(in_stack_00000008 + (long)local_10 * 0x38),
           *(undefined8 *)(in_stack_00000008 + (long)local_10 * 0x38 + 8),
           *(undefined8 *)(in_stack_00000008 + (long)local_10 * 0x38 + 0x10),
           *(undefined8 *)(in_stack_00000008 + (long)local_10 * 0x38 + 0x18),
           *(undefined8 *)(in_stack_00000008 + (long)local_10 * 0x38 + 0x20));
  }
  printf("----------------------------------\n");
  return;
}

Assistant:

void print_key_file(const econf_file key_file)
{
  printf("----------------------------------\n");
  printf("path: %s\n", key_file.path);
  printf("delimiter: %c, comment: %c\n", key_file.delimiter, key_file.comment);
  printf("values:\n");
  for(size_t i = 0; i < key_file.length; i++)
  {
    printf("  group: %s ; key: %s ; value: %s ; pre_comment %s ; added_comment: %s\n",
	   key_file.file_entry[i].group,
	   key_file.file_entry[i].key,
	   key_file.file_entry[i].value,
	   key_file.file_entry[i].comment_before_key,
	   key_file.file_entry[i].comment_after_value
	   );
  }
  printf("----------------------------------\n");
}